

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergeOverlappingSamples.cpp
# Opt level: O0

void mergeOverlappingSamples(float a1,float c1,float a2,float c2,float *am,float *cm)

{
  float fVar1;
  float *pfVar2;
  float *in_RSI;
  float *in_RDI;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM3_Da;
  float w;
  float u;
  float v2;
  float u2;
  float v1;
  float u1;
  float local_54;
  float local_50;
  float local_4c;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float *local_20;
  float *local_18;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_24 = 0.0;
  local_28 = 1.0;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM3_Da;
  local_8 = in_XMM1_Da;
  pfVar2 = std::min<float>(&local_4,&local_28);
  pfVar2 = std::max<float>(&local_24,pfVar2);
  local_4 = *pfVar2;
  local_2c = 0.0;
  local_30 = 1.0;
  pfVar2 = std::min<float>(&local_c,&local_30);
  pfVar2 = std::max<float>(&local_2c,pfVar2);
  local_c = *pfVar2;
  *local_18 = -local_4 * local_c + local_4 + local_c;
  if ((((local_4 != 1.0) || (NAN(local_4))) || (local_c != 1.0)) || (NAN(local_c))) {
    if ((local_4 != 1.0) || (NAN(local_4))) {
      if ((local_c != 1.0) || (NAN(local_c))) {
        dVar3 = std::log1p((double)(ulong)(uint)-local_4);
        local_54 = -SUB84(dVar3,0);
        if (local_4 * 3.4028235e+38 <= local_54) {
          local_4c = 1.0;
        }
        else {
          local_4c = local_54 / local_4;
        }
        dVar3 = std::log1p((double)(ulong)(uint)-local_c);
        fVar1 = -SUB84(dVar3,0);
        if (local_c * 3.4028235e+38 <= fVar1) {
          local_50 = 1.0;
        }
        else {
          local_50 = fVar1 / local_c;
        }
        local_54 = local_54 + fVar1;
        if ((1.0 < local_54) || (*local_18 < local_54 * 3.4028235e+38)) {
          local_54 = *local_18 / local_54;
        }
        else {
          local_54 = 1.0;
        }
        *local_20 = (local_8 * local_4c + local_10 * local_50) * local_54;
      }
      else {
        *local_20 = local_10;
      }
    }
    else {
      *local_20 = local_8;
    }
  }
  else {
    *local_20 = (local_8 + local_10) / 2.0;
  }
  return;
}

Assistant:

void
mergeOverlappingSamples (
    float  a1,
    float  c1, // Opacity and color of first sample
    float  a2,
    float  c2, // Opacity and color of second sample
    float& am,
    float& cm) // Opacity and color of merged sample
{
    //
    // This function merges two perfectly overlapping volume or point
    // samples. Given the color and opacity of two samples, it returns
    // the color and opacity of the merged sample.
    //
    // The code below is written to avoid very large rounding errors when
    // the opacity of one or both samples is very small:
    //
    // * The merged opacity must not be computed as 1 - (1-a1) \*
    //   (1-a2).  If a1 and a2 are less than about half a
    //   floating-point epsilon, the expressions (1-a1) and (1-a2)
    //   evaluate to 1.0 exactly, and the merged opacity becomes
    //   0.0. The error is amplified later in the calculation of the
    //   merged color.
    //
    //   Changing the calculation of the merged opacity to a1 + a2 -
    //   a1*a2 avoids the excessive rounding error.
    //
    // * For small x, the logarithm of 1+x is approximately equal to
    //   x, but log(1+x) returns 0 because 1+x evaluates to 1.0
    //   exactly.  This can lead to large errors in the calculation of
    //   the merged color if a1 or a2 is very small.
    //
    //   The math library function log1p(x) returns the logarithm of
    //   1+x, but without attempting to evaluate the expression 1+x
    //   when x is very small.
    //

    a1 = max (0.0f, min (a1, 1.0f));
    a2 = max (0.0f, min (a2, 1.0f));

    am = a1 + a2 - a1 * a2;

    if (a1 == 1 && a2 == 1) { cm = (c1 + c2) / 2; }
    else if (a1 == 1)
    {
        cm = c1;
    }
    else if (a2 == 1)
    {
        cm = c2;
    }
    else
    {
        static const float MAX = numeric_limits<float>::max ();

        float u1 = -log1p (-a1);
        float v1 = (u1 < a1 * MAX) ? u1 / a1 : 1;

        float u2 = -log1p (-a2);
        float v2 = (u2 < a2 * MAX) ? u2 / a2 : 1;

        float u = u1 + u2;
        float w = (u > 1 || am < u * MAX) ? am / u : 1;

        cm = (c1 * v1 + c2 * v2) * w;
    }
}